

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O1

FieldDescriptor * __thiscall
google::protobuf::Descriptor::FindFieldByLowercaseName(Descriptor *this,ConstStringParam key)

{
  FileDescriptorTables *pFVar1;
  pointer pcVar2;
  size_t size;
  second_type pFVar3;
  FieldDescriptor *pFVar4;
  FileDescriptorTables *local_48;
  first_type local_40;
  
  pFVar1 = *(FileDescriptorTables **)(*(long *)(this + 0x10) + 0x80);
  pcVar2 = (key->_M_dataplus)._M_p;
  size = key->_M_string_length;
  if ((long)size < 0) {
    stringpiece_internal::StringPiece::LogFatalSizeTooBig(size,"string length exceeds max size");
  }
  local_40.first = FileDescriptorTables::FieldsByLowercaseNamesLazyInitStatic;
  local_48 = pFVar1;
  std::
  call_once<void(*)(google::protobuf::FileDescriptorTables_const*),google::protobuf::FileDescriptorTables_const*>
            (&pFVar1->fields_by_lowercase_name_once_,
             (_func_void_FileDescriptorTables_ptr **)&local_40,&local_48);
  local_40.first = this;
  local_40.second.ptr_ = pcVar2;
  local_40.second.length_ = size;
  pFVar3 = FindPtrOrNull<std::unordered_map<std::pair<void_const*,google::protobuf::stringpiece_internal::StringPiece>,google::protobuf::FieldDescriptor_const*,google::protobuf::(anonymous_namespace)::PointerStringPairHash,std::equal_to<std::pair<void_const*,google::protobuf::stringpiece_internal::StringPiece>>,std::allocator<std::pair<std::pair<void_const*,google::protobuf::stringpiece_internal::StringPiece>const,google::protobuf::FieldDescriptor_const*>>>>
                     (&pFVar1->fields_by_lowercase_name_,&local_40);
  if (pFVar3 == (second_type)0x0) {
    pFVar4 = (FieldDescriptor *)0x0;
  }
  else {
    pFVar4 = (FieldDescriptor *)0x0;
    if (((byte)pFVar3[1] & 8) == 0) {
      pFVar4 = pFVar3;
    }
  }
  return pFVar4;
}

Assistant:

const FieldDescriptor* Descriptor::FindFieldByLowercaseName(
    ConstStringParam key) const {
  const FieldDescriptor* result =
      file()->tables_->FindFieldByLowercaseName(this, key);
  if (result == nullptr || result->is_extension()) {
    return nullptr;
  } else {
    return result;
  }
}